

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::getPointsToNodeOrNull(LLVMPointerGraphBuilder *this,Value *val)

{
  PSNodesSeq *pPVar1;
  LLVMPointerGraphBuilder *in_RSI;
  PSNodesSeq *in_RDI;
  PSNodesSeq *nds;
  PSNode *mp;
  Value *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  local_8 = PointsToMapping<const_llvm::Value_*>::get
                      ((PointsToMapping<const_llvm::Value_*> *)in_RSI,in_stack_ffffffffffffffe0);
  if (local_8 == (PSNode *)0x0) {
    pPVar1 = getNodes(in_RSI,(Value *)0x0);
    if (pPVar1 == (PSNodesSeq *)0x0) {
      local_8 = (PSNode *)0x0;
    }
    else {
      local_8 = PSNodesSeq::getRepresentant(in_RDI);
    }
  }
  return local_8;
}

Assistant:

PSNode *getPointsToNodeOrNull(const llvm::Value *val) {
        // if we have a mapping for this node (e.g. the original
        // node was optimized away and replaced by mapping),
        // return it
        if (auto *mp = mapping.get(val))
            return mp;
        if (auto *nds = getNodes(val)) {
            // otherwise get the representant of the built nodes
            return nds->getRepresentant();
        }

        // not built!
        return nullptr;
    }